

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::Tracks::~Tracks(Tracks *this)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  long in_RDI;
  Track *pTrack;
  Track **j;
  Track **i;
  long *local_10;
  
  plVar1 = *(long **)(in_RDI + 0x30);
  local_10 = *(long **)(in_RDI + 0x28);
  while (local_10 != plVar1) {
    plVar3 = local_10 + 1;
    plVar2 = (long *)*local_10;
    local_10 = plVar3;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if (*(void **)(in_RDI + 0x28) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x28));
  }
  return;
}

Assistant:

Tracks::~Tracks() {
  Track** i = m_trackEntries;
  Track** const j = m_trackEntriesEnd;

  while (i != j) {
    Track* const pTrack = *i++;
    delete pTrack;
  }

  delete[] m_trackEntries;
}